

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
::createInstance(QueryPoolGraphicStatisticsTest<vkt::QueryPool::(anonymous_namespace)::GeometryShaderSecondaryTestInstance>
                 *this,Context *context)

{
  TestInstance *pTVar1;
  
  pTVar1 = (TestInstance *)operator_new(0x108);
  pTVar1->m_context = context;
  *(undefined4 *)&pTVar1[1]._vptr_TestInstance = 0x25;
  memset(&pTVar1[1].m_context,0,0xe0);
  pTVar1[0xf].m_context = (Context *)&this->m_data;
  pTVar1[0x10]._vptr_TestInstance = (_func_int **)&this->m_parametersGraphic;
  pTVar1->_vptr_TestInstance = (_func_int **)&PTR__GraphicBasicTestInstance_00bd7278;
  return pTVar1;
}

Assistant:

vkt::TestInstance* createInstance (vkt::Context& context) const
	{
		return new Instance(context, m_data, m_parametersGraphic);
	}